

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int execSql(sqlite3 *db,char **pzErrMsg,char *zSql)

{
  sqlite3_stmt *pStmt_00;
  int iVar1;
  int iVar2;
  uchar *zSql_00;
  char *zNew;
  bool bVar3;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_28;
  
  iVar1 = sqlite3LockAndPrepare(db,zSql,-1,0x80,(Vdbe *)0x0,&local_28,(char **)0x0);
  pStmt_00 = local_28;
  if (iVar1 == 0) {
    do {
      iVar2 = sqlite3_step(pStmt_00);
      if (iVar2 != 100) break;
      zSql_00 = sqlite3_column_text(pStmt_00,0);
      if (zSql_00 == (uchar *)0x0) {
        bVar3 = true;
        iVar2 = 100;
      }
      else {
        iVar2 = execSql(db,pzErrMsg,(char *)zSql_00);
        bVar3 = iVar2 == 0;
      }
    } while (bVar3);
    iVar1 = 0;
    if (iVar2 != 0x65) {
      iVar1 = iVar2;
    }
    if (iVar1 != 0) {
      zNew = sqlite3_errmsg(db);
      sqlite3SetString(pzErrMsg,db,zNew);
    }
    sqlite3_finalize(local_28);
  }
  return iVar1;
}

Assistant:

static int execSql(sqlite3 *db, char **pzErrMsg, const char *zSql){
  sqlite3_stmt *pStmt;
  int rc;

  /* printf("SQL: [%s]\n", zSql); fflush(stdout); */
  rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
  if( rc!=SQLITE_OK ) return rc;
  while( SQLITE_ROW==(rc = sqlite3_step(pStmt)) ){
    const char *zSubSql = (const char*)sqlite3_column_text(pStmt,0);
    assert( sqlite3_strnicmp(zSql,"SELECT",6)==0 );
    if( zSubSql ){
      assert( zSubSql[0]!='S' );
      rc = execSql(db, pzErrMsg, zSubSql);
      if( rc!=SQLITE_OK ) break;
    }
  }
  assert( rc!=SQLITE_ROW );
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  if( rc ){
    sqlite3SetString(pzErrMsg, db, sqlite3_errmsg(db));
  }
  (void)sqlite3_finalize(pStmt);
  return rc;
}